

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O0

void __thiscall FGLRenderer::DrawBlend(FGLRenderer *this,sector_t *viewsector)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint32 uVar5;
  uint32 uVar6;
  DWORD other;
  int iVar7;
  int b;
  lightlist_t *plVar8;
  AActor *pAVar9;
  player_t *local_c0;
  player_t *player_1;
  undefined1 local_78 [4];
  int maxcol;
  TVector2<double> local_68;
  double local_58;
  double lightbottom;
  TArray<lightlist_t,_lightlist_t> *pTStack_48;
  uint i;
  TArray<lightlist_t,_lightlist_t> *lightlist;
  player_t *player;
  float extra_blue;
  float extra_green;
  float extra_red;
  PalEntry blendv;
  float blend [4];
  sector_t *viewsector_local;
  FGLRenderer *this_local;
  
  memset(&extra_red,0,0x10);
  PalEntry::PalEntry((PalEntry *)&extra_green,0);
  lightlist = (TArray<lightlist_t,_lightlist_t> *)0x0;
  bVar2 = TObjPtr<AActor>::operator!=
                    ((TObjPtr<AActor> *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0),(AActor *)0x0)
  ;
  if (bVar2) {
    pAVar9 = TObjPtr<AActor>::operator->
                       ((TObjPtr<AActor> *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0));
    lightlist = (TArray<lightlist_t,_lightlist_t> *)pAVar9->player;
  }
  if (gl_fixedcolormap != 0) goto LAB_00522ebc;
  uVar3 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                    ((TArray<F3DFloor_*,_F3DFloor_*> *)&viewsector->e->XFloor);
  if (uVar3 == 0) {
    if ((viewsector->heightsec != (sector_t *)0x0) && ((viewsector->MoreFlags & 0x10) == 0)) {
      if (in_area == area_normal) {
LAB_00522ae5:
        PalEntry::operator=((PalEntry *)&extra_green,viewsector->heightsec->midmap);
      }
      else if (in_area == area_below) {
        PalEntry::operator=((PalEntry *)&extra_green,viewsector->heightsec->bottommap);
      }
      else {
        if (in_area != area_above) goto LAB_00522ae5;
        PalEntry::operator=((PalEntry *)&extra_green,viewsector->heightsec->topmap);
      }
    }
  }
  else {
    pTStack_48 = &(viewsector->e->XFloor).lightlist;
    for (lightbottom._4_4_ = 0; uVar3 = lightbottom._4_4_,
        uVar4 = TArray<lightlist_t,_lightlist_t>::Size(pTStack_48), uVar1 = lightbottom._4_4_,
        uVar3 < uVar4; lightbottom._4_4_ = lightbottom._4_4_ + 1) {
      uVar3 = TArray<lightlist_t,_lightlist_t>::Size(pTStack_48);
      if (uVar1 < uVar3 - 1) {
        plVar8 = TArray<lightlist_t,_lightlist_t>::operator[]
                           (pTStack_48,(ulong)(lightbottom._4_4_ + 1));
        TVector2<double>::TVector2(&local_68,&ViewPos);
        local_58 = secplane_t::ZatPoint(&plVar8->plane,&local_68);
      }
      else {
        TVector2<double>::TVector2((TVector2<double> *)local_78,&ViewPos);
        local_58 = secplane_t::ZatPoint(&viewsector->floorplane,(DVector2 *)local_78);
      }
      if ((local_58 < ViewPos.Z) &&
         ((plVar8 = TArray<lightlist_t,_lightlist_t>::operator[]
                              (pTStack_48,(ulong)lightbottom._4_4_),
          plVar8->caster == (F3DFloor *)0x0 ||
          (plVar8 = TArray<lightlist_t,_lightlist_t>::operator[]
                              (pTStack_48,(ulong)lightbottom._4_4_),
          (plVar8->caster->flags & 0x8000000) == 0)))) {
        plVar8 = TArray<lightlist_t,_lightlist_t>::operator[](pTStack_48,(ulong)lightbottom._4_4_);
        extra_green = *(float *)&(plVar8->blend).field_0;
        uVar6 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)&extra_green);
        uVar5 = PalEntry::operator_cast_to_unsigned_int(&viewsector->ColorMap->Fade);
        if (uVar6 == uVar5) {
          PalEntry::operator=((PalEntry *)&extra_green,0);
        }
        if ((extra_green._3_1_ == '\0') &&
           (uVar6 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)&extra_green), uVar6 != 0))
        {
          extra_green = (float)CONCAT13(0x80,extra_green._0_3_);
        }
        break;
      }
    }
  }
  if (extra_green._3_1_ == '\0') {
    uVar6 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)&extra_green);
    other = R_BlendForColormap(uVar6);
    PalEntry::operator=((PalEntry *)&extra_green,other);
    if (extra_green._3_1_ == -1) {
      iVar7 = MAX<int>(this->framebuffer->palette_brightness,(uint)extra_green >> 0x10 & 0xff);
      b = MAX<int>((uint)extra_green >> 8 & 0xff,(uint)extra_green & 0xff);
      iVar7 = MAX<int>(iVar7,b);
      extra_green = (float)CONCAT31(CONCAT21(CONCAT11(extra_green._3_1_,
                                                      (char)((long)(ulong)(((uint)extra_green >>
                                                                            0x10 & 0xff) * 0xff) /
                                                            (long)iVar7)),
                                             (char)((long)(ulong)(((uint)extra_green >> 8 & 0xff) *
                                                                 0xff) / (long)iVar7)),
                                    (char)((long)(ulong)(((uint)extra_green & 0xff) * 0xff) /
                                          (long)iVar7));
    }
  }
  if (extra_green._3_1_ == 0xff) {
    extra_blue = (float)extra_green._2_1_ / 255.0;
    player._4_4_ = (float)extra_green._1_1_ / 255.0;
    player._0_4_ = (float)((uint)extra_green & 0xff) / 255.0;
    PalEntry::operator=((PalEntry *)&extra_green,0);
    if ((((extra_blue != 0.0) || (NAN(extra_blue))) || (player._4_4_ != 0.0)) ||
       (((NAN(player._4_4_) || (player._0_4_ != 0.0)) || (NAN(player._0_4_))))) {
      FRenderState::BlendFunc(&gl_RenderState,0x306,0);
      FRenderState::SetColor(&gl_RenderState,extra_blue,player._4_4_,player._0_4_,1.0,0);
      gl_FillScreen();
    }
  }
  else if (extra_green._3_1_ != 0) {
    V_AddBlend((float)extra_green._2_1_ / 255.0,(float)extra_green._1_1_ / 255.0,
               (float)((uint)extra_green & 0xff) / 255.0,(float)extra_green._3_1_ / 255.0,&extra_red
              );
  }
LAB_00522ebc:
  if (lightlist != (TArray<lightlist_t,_lightlist_t> *)0x0) {
    V_AddPlayerBlend((player_t *)lightlist,&extra_red,0.5,0xaf);
  }
  bVar2 = TObjPtr<AActor>::operator!=
                    ((TObjPtr<AActor> *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0),(AActor *)0x0)
  ;
  if (bVar2) {
    pAVar9 = TObjPtr<AActor>::operator->
                       ((TObjPtr<AActor> *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0));
    if (pAVar9->player == (player_t *)0x0) {
      local_c0 = (player_t *)(&players + (long)consoleplayer * 0x54);
    }
    else {
      pAVar9 = TObjPtr<AActor>::operator->
                         ((TObjPtr<AActor> *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0));
      local_c0 = pAVar9->player;
    }
    V_AddBlend(local_c0->BlendR,local_c0->BlendG,local_c0->BlendB,local_c0->BlendA,&extra_red);
  }
  FRenderState::BlendFunc(&gl_RenderState,0x302,0x303);
  if (0.0 < blend[1]) {
    FRenderState::SetColor(&gl_RenderState,extra_red,(float)blendv.field_0,blend[0],blend[1],0);
    gl_FillScreen();
  }
  FRenderState::ResetColor(&gl_RenderState);
  FRenderState::EnableTexture(&gl_RenderState,true);
  return;
}

Assistant:

void FGLRenderer::DrawBlend(sector_t * viewsector)
{
	float blend[4]={0,0,0,0};
	PalEntry blendv=0;
	float extra_red;
	float extra_green;
	float extra_blue;
	player_t *player = NULL;

	if (players[consoleplayer].camera != NULL)
	{
		player=players[consoleplayer].camera->player;
	}

	// don't draw sector based blends when an invulnerability colormap is active
	if (!gl_fixedcolormap)
	{
		if (!viewsector->e->XFloor.ffloors.Size())
		{
			if (viewsector->heightsec && !(viewsector->MoreFlags&SECF_IGNOREHEIGHTSEC))
			{
				switch (in_area)
				{
				default:
				case area_normal: blendv = viewsector->heightsec->midmap; break;
				case area_above: blendv = viewsector->heightsec->topmap; break;
				case area_below: blendv = viewsector->heightsec->bottommap; break;
				}
			}
		}
		else
		{
			TArray<lightlist_t> & lightlist = viewsector->e->XFloor.lightlist;

			for (unsigned int i = 0; i < lightlist.Size(); i++)
			{
				double lightbottom;
				if (i < lightlist.Size() - 1)
					lightbottom = lightlist[i + 1].plane.ZatPoint(ViewPos);
				else
					lightbottom = viewsector->floorplane.ZatPoint(ViewPos);

				if (lightbottom < ViewPos.Z && (!lightlist[i].caster || !(lightlist[i].caster->flags&FF_FADEWALLS)))
				{
					// 3d floor 'fog' is rendered as a blending value
					blendv = lightlist[i].blend;
					// If this is the same as the sector's it doesn't apply!
					if (blendv == viewsector->ColorMap->Fade) blendv = 0;
					// a little hack to make this work for Legacy maps.
					if (blendv.a == 0 && blendv != 0) blendv.a = 128;
					break;
				}
			}
		}

		if (blendv.a == 0)
		{
			blendv = R_BlendForColormap(blendv);
			if (blendv.a == 255)
			{
				// The calculated average is too dark so brighten it according to the palettes's overall brightness
				int maxcol = MAX<int>(MAX<int>(framebuffer->palette_brightness, blendv.r), MAX<int>(blendv.g, blendv.b));
				blendv.r = blendv.r * 255 / maxcol;
				blendv.g = blendv.g * 255 / maxcol;
				blendv.b = blendv.b * 255 / maxcol;
			}
		}

		if (blendv.a == 255)
		{

			extra_red = blendv.r / 255.0f;
			extra_green = blendv.g / 255.0f;
			extra_blue = blendv.b / 255.0f;

			// If this is a multiplicative blend do it separately and add the additive ones on top of it.
			blendv = 0;

			// black multiplicative blends are ignored
			if (extra_red || extra_green || extra_blue)
			{
				gl_RenderState.BlendFunc(GL_DST_COLOR, GL_ZERO);
				gl_RenderState.SetColor(extra_red, extra_green, extra_blue, 1.0f);
				gl_FillScreen();
			}
		}
		else if (blendv.a)
		{
			V_AddBlend(blendv.r / 255.f, blendv.g / 255.f, blendv.b / 255.f, blendv.a / 255.0f, blend);
		}
	}

	// This mostly duplicates the code in shared_sbar.cpp
	// When I was writing this the original was called too late so that I
	// couldn't get the blend in time. However, since then I made some changes
	// here that would get lost if I switched back so I won't do it.

	if (player)
	{
		V_AddPlayerBlend(player, blend, 0.5, 175);
	}
	
	if (players[consoleplayer].camera != NULL)
	{
		// except for fadeto effects
		player_t *player = (players[consoleplayer].camera->player != NULL) ? players[consoleplayer].camera->player : &players[consoleplayer];
		V_AddBlend (player->BlendR, player->BlendG, player->BlendB, player->BlendA, blend);
	}

	gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
	if (blend[3]>0.0f)
	{
		gl_RenderState.SetColor(blend[0], blend[1], blend[2], blend[3]);
		gl_FillScreen();
	}
	gl_RenderState.ResetColor();
	gl_RenderState.EnableTexture(true);
}